

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.h
# Opt level: O2

ostream * absl::operator<<(ostream *os,crc32c_t crc)

{
  ostream *poVar1;
  uint32_t local_74;
  FormatSpec<unsigned_int> local_70;
  Streamable local_60;
  
  local_70.super_type.spec_.data_ = "%08x";
  local_70.super_type.spec_.size_ = 4;
  local_74 = crc.crc_;
  StreamFormat<unsigned_int>(&local_60,&local_70,&local_74);
  poVar1 = str_format_internal::Streamable::Print(&local_60,os);
  inlined_vector_internal::
  Storage<absl::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::str_format_internal::FormatArgImpl>_>
  ::~Storage(&local_60.args_.storage_);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, crc32c_t crc) {
  return os << absl::StreamFormat("%08x", static_cast<uint32_t>(crc));
}